

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O1

void * get_FMfieldAddr_by_name(FMFieldList field_list,char *fieldname,void *data)

{
  int iVar1;
  FMFieldList p_Var2;
  long lVar3;
  bool bVar4;
  
  bVar4 = field_list->field_name == (char *)0x0;
  if (!bVar4) {
    iVar1 = strcmp(field_list->field_name,fieldname);
    if (iVar1 == 0) {
      lVar3 = 0;
    }
    else {
      p_Var2 = field_list + 1;
      lVar3 = 0;
      do {
        bVar4 = p_Var2->field_name == (char *)0x0;
        if (bVar4) {
          return (void *)0x0;
        }
        iVar1 = strcmp(p_Var2->field_name,fieldname);
        p_Var2 = p_Var2 + 1;
        lVar3 = lVar3 + 1;
      } while (iVar1 != 0);
    }
    if (!bVar4) {
      return (void *)((long)data + (long)field_list[lVar3].field_offset);
    }
  }
  return (void *)0x0;
}

Assistant:

extern void *
get_FMfieldAddr_by_name(FMFieldList field_list, const char *fieldname, void *data)
{
    int index;

    for (index = 0; field_list[index].field_name != NULL; index++) {
	if (strcmp(field_list[index].field_name, fieldname) == 0) {
	    break;
	}
    }
    if (field_list[index].field_name == NULL)
	return NULL;

    return ((char*)data) + field_list[index].field_offset;
}